

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duseltronik.hpp
# Opt level: O0

bool tao::pegtl::internal::
     duseltronik<queryparse::gram3_token,(tao::pegtl::apply_mode)1,(tao::pegtl::rewind_mode)1,tao::pegtl::nothing,tao::pegtl::parse_tree::internal::make_control<queryparse::store,tao::pegtl::normal>::type,(tao::pegtl::dusel_mode)1>
     ::
     match<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,tao::pegtl::parse_tree::internal::state<tao::pegtl::parse_tree::node>&>
               (string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in,state<tao::pegtl::parse_tree::node> *st)

{
  bool bVar1;
  state<tao::pegtl::parse_tree::node> *in_RSI;
  string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  state<tao::pegtl::parse_tree::node> *in_stack_00000018;
  string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000020;
  
  parse_tree::internal::make_control<queryparse::store,tao::pegtl::normal>::
  control<queryparse::gram3_token,true>::
  start<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,tao::pegtl::parse_tree::node>
            (in_RDI,in_RSI);
  bVar1 = duseltronik<queryparse::gram3_token,(tao::pegtl::apply_mode)1,(tao::pegtl::rewind_mode)1,tao::pegtl::nothing,tao::pegtl::parse_tree::internal::make_control<queryparse::store,tao::pegtl::normal>::type,(tao::pegtl::dusel_mode)0>
          ::
          match<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,tao::pegtl::parse_tree::internal::state<tao::pegtl::parse_tree::node>&,0>
                    (in_RDI,in_RSI);
  if (bVar1) {
    parse_tree::internal::make_control<queryparse::store,tao::pegtl::normal>::
    control<queryparse::gram3_token,true>::
    success<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,tao::pegtl::parse_tree::node>
              (in_stack_00000020,in_stack_00000018);
  }
  else {
    parse_tree::internal::make_control<queryparse::store,tao::pegtl::normal>::
    control<queryparse::gram3_token,true>::
    failure<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,tao::pegtl::parse_tree::node>
              (in_RDI,in_RSI);
  }
  return bVar1;
}

Assistant:

static bool match( Input& in, States&&... st )
            {
               Control< Rule >::start( static_cast< const Input& >( in ), st... );

               if( duseltronik< Rule, A, M, Action, Control, dusel_mode::NOTHING >::match( in, st... ) ) {
                  Control< Rule >::success( static_cast< const Input& >( in ), st... );
                  return true;
               }
               Control< Rule >::failure( static_cast< const Input& >( in ), st... );
               return false;
            }